

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_35d0fd::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this_00;
  pointer *ppSVar1;
  pointer pSVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  size_t extraout_RDX_01;
  char *pcVar6;
  StringRef local_48;
  char local_38;
  undefined7 uStack_37;
  
  pcVar6 = value.Data;
  if (name.Length == 4) {
    if (*(int *)name.Data == 0x73677261) {
      pSVar2 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar2) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar2;
      }
      this_00 = &this->args;
      iVar5 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                        (ctx->delegate,llbuild::basic::DefaultShellPath_abi_cxx11_,DAT_00248a58);
      local_48.Data = (char *)CONCAT44(extraout_var,iVar5);
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,&local_48);
      }
      else {
        local_48.Length._0_4_ = (undefined4)extraout_RDX;
        local_48.Length._4_4_ = (undefined4)((ulong)extraout_RDX >> 0x20);
        *(int *)&(iVar3._M_current)->Data = iVar5;
        *(undefined4 *)((long)&(iVar3._M_current)->Data + 4) = extraout_var;
        *(undefined4 *)&(iVar3._M_current)->Length = (undefined4)local_48.Length;
        *(undefined4 *)((long)&(iVar3._M_current)->Length + 4) = local_48.Length._4_4_;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      iVar5 = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,"-c",2);
      local_48.Data = (char *)CONCAT44(extraout_var_00,iVar5);
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,&local_48);
      }
      else {
        local_48.Length._0_4_ = (undefined4)extraout_RDX_00;
        local_48.Length._4_4_ = (undefined4)((ulong)extraout_RDX_00 >> 0x20);
        *(int *)&(iVar3._M_current)->Data = iVar5;
        *(undefined4 *)((long)&(iVar3._M_current)->Data + 4) = extraout_var_00;
        *(undefined4 *)&(iVar3._M_current)->Length = (undefined4)local_48.Length;
        *(undefined4 *)((long)&(iVar3._M_current)->Length + 4) = local_48.Length._4_4_;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      iVar5 = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,pcVar6,value.Length);
      local_48.Data = (char *)CONCAT44(extraout_var_01,iVar5);
      iVar3._M_current =
           (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(this_00,iVar3,&local_48);
      }
      else {
        (iVar3._M_current)->Data = local_48.Data;
        (iVar3._M_current)->Length = extraout_RDX_01;
        ppSVar1 = &(this->args).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    else {
      if (*(int *)name.Data != 0x73706564) goto LAB_0019316f;
      local_48.Data = &local_38;
      if (pcVar6 == (char *)0x0) {
        local_48.Length = 0;
        local_38 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,pcVar6,pcVar6 + value.Length);
      }
      std::__cxx11::string::operator=((string *)&this->depsPath,(string *)&local_48);
      if (local_48.Data != &local_38) {
        operator_delete(local_48.Data,CONCAT71(uStack_37,local_38) + 1);
      }
    }
    return true;
  }
LAB_0019316f:
  bVar4 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,value);
  return bVar4;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "args") {
      // When provided as a scalar string, we default to executing using the
      // shell.
      args.clear();
      args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
      args.push_back(ctx.getDelegate().getInternedString("-c"));
      args.push_back(ctx.getDelegate().getInternedString(value));
    } else if (name == "deps") {
      depsPath = value;
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }